

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O0

unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
__thiscall ApplicationFactory::makeContext(ApplicationFactory *this)

{
  PileId *this_00;
  uint *puVar1;
  unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>
  *this_01;
  pointer pSVar2;
  unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>
  *this_02;
  Position local_e8;
  Position local_e0;
  unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> local_d8;
  unique_ptr<solitaire::Context,_std::default_delete<solitaire::Context>_> local_d0;
  PileId local_c8;
  PileId local_c4;
  Position local_c0;
  Position local_b8;
  uint local_b0;
  PileId local_ac;
  undefined1 local_a8 [4];
  PileId id_1;
  TableauPileColliders tableauPileColliders;
  Position local_60 [3];
  uint local_48;
  PileId local_44;
  undefined1 local_40 [4];
  PileId id;
  FoundationPileColliders foundationPileColliders;
  unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  solitaire;
  ApplicationFactory *this_local;
  
  makeSolitaire((ApplicationFactory *)(foundationPileColliders._M_elems + 3));
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  ::array((array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
           *)local_40);
  local_48 = 0;
  ::solitaire::piles::PileId::PileId(&local_44,&local_48);
  while( true ) {
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_44);
    if (3 < *puVar1) break;
    this_00 = (PileId *)
              ((long)&tableauPileColliders._M_elems[6]._M_t.
                      super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                      .
                      super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                      ._M_head_impl + 4);
    ::solitaire::piles::PileId::PileId(this_00,&local_44);
    ::solitaire::Layout::getFoundationPilePosition(this_00);
    std::make_unique<solitaire::colliders::FoundationPileCollider,solitaire::geometry::Position>
              (local_60);
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_44);
    this_01 = (unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>
               *)std::
                 array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
                 ::operator[]((array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
                               *)local_40,(ulong)*puVar1);
    std::
    unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>
    ::operator=(this_01,(unique_ptr<solitaire::colliders::FoundationPileCollider,_std::default_delete<solitaire::colliders::FoundationPileCollider>_>
                         *)local_60);
    std::
    unique_ptr<solitaire::colliders::FoundationPileCollider,_std::default_delete<solitaire::colliders::FoundationPileCollider>_>
    ::~unique_ptr((unique_ptr<solitaire::colliders::FoundationPileCollider,_std::default_delete<solitaire::colliders::FoundationPileCollider>_>
                   *)local_60);
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_44);
    *puVar1 = *puVar1 + 1;
  }
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  ::array((array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
           *)local_a8);
  local_b0 = 0;
  ::solitaire::piles::PileId::PileId(&local_ac,&local_b0);
  while( true ) {
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_ac);
    if (6 < *puVar1) break;
    ::solitaire::piles::PileId::PileId(&local_c4,&local_ac);
    local_c0 = ::solitaire::Layout::getTableauPilePosition(&local_c4);
    pSVar2 = std::
             unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
             ::operator->((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
                           *)(foundationPileColliders._M_elems + 3));
    ::solitaire::piles::PileId::PileId(&local_c8,&local_ac);
    (*pSVar2->_vptr_Solitaire[0xe])(pSVar2,&local_c8);
    std::
    make_unique<solitaire::colliders::TableauPileCollider,solitaire::geometry::Position,solitaire::piles::interfaces::TableauPile_const&>
              (&local_b8,(TableauPile *)&local_c0);
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_ac);
    this_02 = (unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>
               *)std::
                 array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
                 ::operator[]((array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
                               *)local_a8,(ulong)*puVar1);
    std::
    unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>
    ::operator=(this_02,(unique_ptr<solitaire::colliders::TableauPileCollider,_std::default_delete<solitaire::colliders::TableauPileCollider>_>
                         *)&local_b8);
    std::
    unique_ptr<solitaire::colliders::TableauPileCollider,_std::default_delete<solitaire::colliders::TableauPileCollider>_>
    ::~unique_ptr((unique_ptr<solitaire::colliders::TableauPileCollider,_std::default_delete<solitaire::colliders::TableauPileCollider>_>
                   *)&local_b8);
    puVar1 = ::solitaire::piles::PileId::operator_cast_to_unsigned_int_(&local_ac);
    *puVar1 = *puVar1 + 1;
  }
  pSVar2 = std::
           unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
           ::operator->((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
                         *)(foundationPileColliders._M_elems + 3));
  (*pSVar2->_vptr_Solitaire[0xf])();
  std::
  make_unique<solitaire::colliders::StockPileCollider,solitaire::piles::interfaces::StockPile_const&>
            ((StockPile *)&local_d8);
  std::
  make_unique<solitaire::Button,solitaire::geometry::Position_const&,solitaire::geometry::Size_const&>
            (&local_e0,(Size *)&::solitaire::Layout::newGameButtonPosition);
  std::
  make_unique<solitaire::Button,solitaire::geometry::Position_const&,solitaire::geometry::Size_const&>
            (&local_e8,(Size *)&::solitaire::Layout::undoButtonPosition);
  std::
  make_unique<solitaire::Context,std::unique_ptr<solitaire::interfaces::Solitaire,std::default_delete<solitaire::interfaces::Solitaire>>,std::array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>,4ul>,std::array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>,7ul>,std::unique_ptr<solitaire::colliders::StockPileCollider,std::default_delete<solitaire::colliders::StockPileCollider>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>>
            ((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
              *)&local_d0,
             (array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
              *)(foundationPileColliders._M_elems + 3),
             (array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
              *)local_40,
             (unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
              *)local_a8,&local_d8,
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)&local_e0);
  std::
  unique_ptr<solitaire::interfaces::Context,std::default_delete<solitaire::interfaces::Context>>::
  unique_ptr<solitaire::Context,std::default_delete<solitaire::Context>,void>
            ((unique_ptr<solitaire::interfaces::Context,std::default_delete<solitaire::interfaces::Context>>
              *)this,&local_d0);
  std::unique_ptr<solitaire::Context,_std::default_delete<solitaire::Context>_>::~unique_ptr
            (&local_d0);
  std::unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_>::~unique_ptr
            ((unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)&local_e8);
  std::unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_>::~unique_ptr
            ((unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)&local_e0);
  std::
  unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
  ::~unique_ptr((unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
                 *)&local_d8);
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  ::~array((array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
            *)local_a8);
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  ::~array((array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
            *)local_40);
  std::
  unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  ::~unique_ptr((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
                 *)(foundationPileColliders._M_elems + 3));
  return (__uniq_ptr_data<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>,_true,_true>
          )(__uniq_ptr_data<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<solitaire::interfaces::Context>
ApplicationFactory::makeContext() const
{
    auto solitaire = makeSolitaire();

    Context::FoundationPileColliders foundationPileColliders;
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        foundationPileColliders[id] =
            std::make_unique<FoundationPileCollider>(
                Layout::getFoundationPilePosition(id));

    Context::TableauPileColliders tableauPileColliders;
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        tableauPileColliders[id] =
            std::make_unique<TableauPileCollider>(
                Layout::getTableauPilePosition(id), solitaire->getTableauPile(id));

    return std::make_unique<Context>(
        std::move(solitaire), std::move(foundationPileColliders),
        std::move(tableauPileColliders),
        std::make_unique<StockPileCollider>(solitaire->getStockPile()),
        std::make_unique<Button>(
            Layout::newGameButtonPosition, Layout::newGameButtonSize
        ),
        std::make_unique<Button>(
            Layout::undoButtonPosition, Layout::undoButtonSize
        )
    );
}